

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# sw_stats_scan_avx2_256_32.c
# Opt level: O3

parasail_result_t *
parasail_sw_stats_scan_profile_avx2_256_32
          (parasail_profile_t *profile,char *s2,int s2Len,int open,int gap)

{
  __m256i alVar1;
  void *pvVar2;
  parasail_matrix_t *ppVar3;
  void *pvVar4;
  void *pvVar5;
  undefined1 auVar6 [32];
  undefined1 auVar7 [32];
  undefined1 auVar8 [32];
  undefined1 auVar9 [32];
  undefined1 auVar10 [32];
  undefined1 auVar11 [32];
  undefined1 auVar12 [32];
  undefined1 auVar13 [32];
  undefined1 auVar14 [32];
  undefined1 auVar15 [32];
  undefined1 auVar16 [32];
  undefined1 auVar17 [32];
  undefined1 auVar18 [32];
  undefined1 auVar19 [32];
  __m256i c;
  __m256i c_00;
  __m256i c_01;
  __m256i c_02;
  __m256i c_03;
  __m256i c_04;
  __m256i c_05;
  uint uVar20;
  ulong uVar21;
  parasail_result_t *ppVar22;
  __m256i *b;
  __m256i *b_00;
  __m256i *b_01;
  __m256i *b_02;
  __m256i *b_03;
  __m256i *b_04;
  __m256i *b_05;
  __m256i *b_06;
  __m256i *__dest;
  __m256i *__dest_00;
  __m256i *__dest_01;
  __m256i *__dest_02;
  __m256i *ptr;
  __m256i *ptr_00;
  size_t __n;
  int iVar23;
  long lVar24;
  long lVar25;
  uint uVar26;
  int iVar27;
  int iVar29;
  int iVar30;
  int iVar31;
  long lVar32;
  uint uVar33;
  uint uVar34;
  ulong uVar35;
  int iVar36;
  undefined1 auVar37 [16];
  undefined1 auVar41 [16];
  undefined1 auVar38 [32];
  undefined1 auVar39 [32];
  undefined1 auVar40 [32];
  undefined1 auVar42 [16];
  undefined1 auVar43 [16];
  undefined1 auVar48 [16];
  undefined1 auVar44 [32];
  undefined1 auVar45 [32];
  undefined1 auVar46 [32];
  undefined1 auVar47 [32];
  undefined1 auVar49 [16];
  undefined1 auVar50 [16];
  undefined1 auVar51 [32];
  undefined1 auVar52 [16];
  undefined1 auVar53 [64];
  undefined1 auVar54 [64];
  undefined1 in_stack_fffffffffffffcc8 [12];
  __m256i *ptr_01;
  __m256i *ptr_02;
  int local_2fc;
  undefined1 local_288 [32];
  undefined1 local_218 [32];
  undefined1 local_1f8 [32];
  undefined1 local_118 [32];
  undefined1 local_f8 [32];
  undefined1 local_58 [32];
  ulong uVar28;
  
  if (profile == (parasail_profile_t *)0x0) {
    parasail_sw_stats_scan_profile_avx2_256_32_cold_8();
  }
  else {
    pvVar2 = (profile->profile32).score;
    if (pvVar2 == (void *)0x0) {
      parasail_sw_stats_scan_profile_avx2_256_32_cold_7();
    }
    else {
      ppVar3 = profile->matrix;
      if (ppVar3 == (parasail_matrix_t *)0x0) {
        parasail_sw_stats_scan_profile_avx2_256_32_cold_6();
      }
      else {
        uVar33 = profile->s1Len;
        uVar21 = (ulong)uVar33;
        if ((int)uVar33 < 1) {
          parasail_sw_stats_scan_profile_avx2_256_32_cold_5();
        }
        else if (s2 == (char *)0x0) {
          parasail_sw_stats_scan_profile_avx2_256_32_cold_4();
        }
        else if (s2Len < 1) {
          parasail_sw_stats_scan_profile_avx2_256_32_cold_3();
        }
        else if (open < 0) {
          parasail_sw_stats_scan_profile_avx2_256_32_cold_2();
        }
        else if (gap < 0) {
          parasail_sw_stats_scan_profile_avx2_256_32_cold_1();
        }
        else {
          pvVar4 = (profile->profile32).matches;
          iVar36 = ppVar3->min;
          uVar20 = 0x80000000 - iVar36;
          if (iVar36 != -open && SBORROW4(iVar36,-open) == iVar36 + open < 0) {
            uVar20 = open | 0x80000000;
          }
          pvVar5 = (profile->profile32).similar;
          iVar36 = 0x7ffffffe - ppVar3->max;
          ppVar22 = parasail_result_new_stats();
          if (ppVar22 != (parasail_result_t *)0x0) {
            local_1f8._0_4_ = s2Len;
            uVar35 = uVar21 + 7 >> 3;
            ppVar22->flag = ppVar22->flag | 0x8410404;
            b = parasail_memalign___m256i(0x20,uVar35);
            b_00 = parasail_memalign___m256i(0x20,uVar35);
            b_01 = parasail_memalign___m256i(0x20,uVar35);
            b_02 = parasail_memalign___m256i(0x20,uVar35);
            b_03 = parasail_memalign___m256i(0x20,uVar35);
            b_04 = parasail_memalign___m256i(0x20,uVar35);
            b_05 = parasail_memalign___m256i(0x20,uVar35);
            b_06 = parasail_memalign___m256i(0x20,uVar35);
            __dest = parasail_memalign___m256i(0x20,uVar35);
            __dest_00 = parasail_memalign___m256i(0x20,uVar35);
            __dest_01 = parasail_memalign___m256i(0x20,uVar35);
            __dest_02 = parasail_memalign___m256i(0x20,uVar35);
            ptr = parasail_memalign___m256i(0x20,uVar35);
            ptr_00 = parasail_memalign___m256i(0x20,uVar35);
            auVar43._8_8_ = 0;
            auVar43._0_8_ = b;
            auVar48._8_8_ = 0;
            auVar48._0_8_ = b_00;
            auVar43 = vpunpcklqdq_avx(auVar43,auVar48);
            auVar37._8_8_ = 0;
            auVar37._0_8_ = b_01;
            auVar41._8_8_ = 0;
            auVar41._0_8_ = b_02;
            auVar48 = vpunpcklqdq_avx(auVar37,auVar41);
            auVar37 = ZEXT116(0) * auVar48 + ZEXT116(1) * auVar43;
            auVar41 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar48;
            auVar42._8_8_ = 0;
            auVar42._0_8_ = b_03;
            auVar49._8_8_ = 0;
            auVar49._0_8_ = b_04;
            auVar43 = vpunpcklqdq_avx(auVar42,auVar49);
            auVar50._8_8_ = 0;
            auVar50._0_8_ = b_05;
            auVar52._8_8_ = 0;
            auVar52._0_8_ = b_06;
            auVar48 = vpunpcklqdq_avx(auVar50,auVar52);
            auVar43 = ZEXT116(0) * auVar48 + ZEXT116(1) * auVar43;
            auVar48 = ZEXT116(0) * SUB4816((undefined1  [48])0x0,0) + ZEXT116(1) * auVar48;
            auVar51 = SUB6432(ZEXT1664((undefined1  [16])0x0),0);
            auVar38._0_8_ = -(ulong)(auVar37._0_8_ == 0);
            auVar38._8_8_ = -(ulong)(auVar37._8_8_ == 0);
            auVar38._16_8_ = -(ulong)(auVar41._0_8_ == 0);
            auVar38._24_8_ = -(ulong)(auVar41._8_8_ == 0);
            auVar44._0_8_ = -(ulong)(auVar43._0_8_ == 0);
            auVar44._8_8_ = -(ulong)(auVar43._8_8_ == 0);
            auVar44._16_8_ = -(ulong)(auVar48._0_8_ == 0);
            auVar44._24_8_ = -(ulong)(auVar48._8_8_ == 0);
            auVar38 = vpackssdw_avx2(auVar38,auVar44);
            if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar38 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar38 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar38 >> 0x7f,0) != '\0') ||
                  (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar38 >> 0xbf,0) != '\0') ||
                (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar38[0x1f] < '\0') {
              return (parasail_result_t *)0x0;
            }
            if (__dest == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (__dest_00 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (__dest_01 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (__dest_02 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            if (ptr_00 == (__m256i *)0x0) {
              return (parasail_result_t *)0x0;
            }
            iVar29 = uVar20 + 1;
            uVar34 = (uint)uVar35;
            auVar39._4_4_ = uVar34;
            auVar39._0_4_ = uVar34;
            auVar39._8_4_ = uVar34;
            auVar39._12_4_ = uVar34;
            auVar39._16_4_ = uVar34;
            auVar39._20_4_ = uVar34;
            auVar39._24_4_ = uVar34;
            auVar39._28_4_ = uVar34;
            auVar19 = vperm2i128_avx2(auVar39,auVar39,0x28);
            iVar31 = -(gap * uVar34);
            auVar40._4_4_ = iVar31;
            auVar40._0_4_ = iVar31;
            auVar40._8_4_ = iVar31;
            auVar40._12_4_ = iVar31;
            auVar40._16_4_ = iVar31;
            auVar40._20_4_ = iVar31;
            auVar40._24_4_ = iVar31;
            auVar40._28_4_ = iVar31;
            auVar38 = vpblendd_avx2(auVar40,ZEXT1632((undefined1  [16])0x0),1);
            auVar40 = ZEXT1632(CONCAT124(SUB6412(ZEXT1664((undefined1  [16])0x0),4),iVar29));
            auVar38 = vpaddd_avx2(auVar40,auVar38);
            alVar1[1]._4_4_ = iVar29;
            alVar1._0_12_ = in_stack_fffffffffffffcc8;
            alVar1[2] = (longlong)b_01;
            alVar1[3] = (longlong)b_00;
            iVar31 = iVar29;
            parasail_memset___m256i(b_03,alVar1,uVar35);
            c[1]._4_4_ = iVar31;
            c._0_12_ = in_stack_fffffffffffffcc8;
            c[2] = (longlong)b_01;
            c[3] = (longlong)b_00;
            parasail_memset___m256i(b_04,c,uVar35);
            c_00[1]._4_4_ = iVar31;
            c_00._0_12_ = in_stack_fffffffffffffcc8;
            c_00[2] = (longlong)b_01;
            c_00[3] = (longlong)b_00;
            parasail_memset___m256i(b_05,c_00,uVar35);
            c_01[1]._4_4_ = iVar31;
            c_01._0_12_ = in_stack_fffffffffffffcc8;
            c_01[2] = (longlong)b_01;
            c_01[3] = (longlong)b_00;
            parasail_memset___m256i(b_06,c_01,uVar35);
            c_02[1]._4_4_ = iVar31;
            c_02._0_12_ = in_stack_fffffffffffffcc8;
            c_02[2] = (longlong)b_01;
            c_02[3] = (longlong)b_00;
            parasail_memset___m256i(b,c_02,uVar35);
            c_03[1]._4_4_ = iVar31;
            c_03._0_12_ = in_stack_fffffffffffffcc8;
            c_03[2] = (longlong)b_01;
            c_03[3] = (longlong)b_00;
            parasail_memset___m256i(b_00,c_03,uVar35);
            c_04[1]._4_4_ = iVar31;
            c_04._0_12_ = in_stack_fffffffffffffcc8;
            c_04[2] = (longlong)b_01;
            c_04[3] = (longlong)b_00;
            parasail_memset___m256i(b_01,c_04,uVar35);
            c_05[1]._4_4_ = iVar31;
            c_05._0_12_ = in_stack_fffffffffffffcc8;
            c_05[2] = (longlong)b_01;
            c_05[3] = (longlong)b_00;
            parasail_memset___m256i(b_02,c_05,uVar35);
            auVar46._4_4_ = gap;
            auVar46._0_4_ = gap;
            auVar46._8_4_ = gap;
            auVar46._12_4_ = gap;
            auVar46._16_4_ = gap;
            auVar46._20_4_ = gap;
            auVar46._24_4_ = gap;
            auVar46._28_4_ = gap;
            auVar16._4_4_ = open;
            auVar16._0_4_ = open;
            auVar16._8_4_ = open;
            auVar16._12_4_ = open;
            auVar16._16_4_ = open;
            auVar16._20_4_ = open;
            auVar16._24_4_ = open;
            auVar16._28_4_ = open;
            uVar20 = uVar34 - 1;
            auVar16 = vpsubd_avx2(SUB6432(ZEXT1664((undefined1  [16])0x0),0),auVar16);
            lVar24 = (ulong)uVar20 << 5;
            auVar45._8_4_ = 1;
            auVar45._0_8_ = 0x100000001;
            auVar45._12_4_ = 1;
            auVar45._16_4_ = 1;
            auVar45._20_4_ = 1;
            auVar45._24_4_ = 1;
            auVar45._28_4_ = 1;
            auVar44 = vpcmpeqd_avx2(auVar51,auVar51);
            uVar28 = uVar35;
            do {
              *(undefined1 (*) [32])((long)*ptr + lVar24) = auVar16;
              *(undefined1 (*) [32])((long)*ptr_00 + lVar24) = auVar45;
              auVar16 = vpsubd_avx2(auVar16,auVar46);
              auVar45 = vpsubd_avx2(auVar45,auVar44);
              lVar24 = lVar24 + -0x20;
              iVar23 = (int)uVar28;
              uVar26 = iVar23 - 1;
              uVar28 = (ulong)uVar26;
            } while (uVar26 != 0 && 0 < iVar23);
            __n = uVar35 << 5;
            auVar44 = vpalignr_avx2(auVar39,auVar19,0xc);
            lVar24 = (ulong)(uVar34 + (uVar34 == 0)) << 5;
            uVar35 = 0;
            local_2fc = 0;
            local_118._4_4_ = iVar29;
            local_118._0_4_ = iVar29;
            local_118._8_4_ = iVar29;
            local_118._12_4_ = iVar29;
            local_118._16_4_ = iVar29;
            local_118._20_4_ = iVar29;
            local_118._24_4_ = iVar29;
            local_118._28_4_ = iVar29;
            auVar19._4_4_ = iVar36;
            auVar19._0_4_ = iVar36;
            auVar19._8_4_ = iVar36;
            auVar19._12_4_ = iVar36;
            auVar19._16_4_ = iVar36;
            auVar19._20_4_ = iVar36;
            auVar19._24_4_ = iVar36;
            auVar19._28_4_ = iVar36;
            ptr_01 = b_01;
            ptr_02 = b_00;
            auVar16 = local_118;
            auVar51 = local_118;
            do {
              lVar25 = (long)(int)(ppVar3->mapper[(byte)s2[uVar35]] * uVar34) * 0x20;
              alVar1 = b_06[uVar20];
              auVar45 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,0x28);
              auVar47 = vpalignr_avx2((undefined1  [32])alVar1,auVar45,0xc);
              alVar1 = b_05[uVar20];
              auVar45 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,0x28);
              auVar39 = vpalignr_avx2((undefined1  [32])alVar1,auVar45,0xc);
              alVar1 = b_04[uVar20];
              auVar45 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,0x28);
              auVar46 = vpalignr_avx2((undefined1  [32])alVar1,auVar45,0xc);
              alVar1 = b_03[uVar20];
              auVar45 = vperm2i128_avx2((undefined1  [32])alVar1,(undefined1  [32])alVar1,0x28);
              auVar45 = vpalignr_avx2((undefined1  [32])alVar1,auVar45,0xc);
              lVar32 = 0;
              local_218 = ZEXT1632(ZEXT816(0));
              local_288 = ZEXT1632(ZEXT816(0));
              auVar53 = ZEXT1664((undefined1  [16])0x0);
              auVar15._4_4_ = iVar29;
              auVar15._0_4_ = iVar29;
              auVar15._8_4_ = iVar29;
              auVar15._12_4_ = iVar29;
              auVar15._16_4_ = iVar29;
              auVar15._20_4_ = iVar29;
              auVar15._24_4_ = iVar29;
              auVar15._28_4_ = iVar29;
              auVar54 = ZEXT1664((undefined1  [16])0x0);
              do {
                auVar7 = vpaddd_avx2(auVar45,*(undefined1 (*) [32])((long)pvVar2 + lVar32 + lVar25))
                ;
                auVar8 = vpaddd_avx2(auVar46,*(undefined1 (*) [32])((long)pvVar4 + lVar32 + lVar25))
                ;
                auVar45 = *(undefined1 (*) [32])((long)*b_03 + lVar32);
                auVar46 = *(undefined1 (*) [32])((long)*b_04 + lVar32);
                auVar9 = vpaddd_avx2(auVar39,*(undefined1 (*) [32])((long)pvVar5 + lVar32 + lVar25))
                ;
                auVar39 = *(undefined1 (*) [32])((long)*b_05 + lVar32);
                auVar10 = vpaddd_avx2(auVar54._0_32_,*(undefined1 (*) [32])((long)*ptr + lVar32));
                auVar17 = vpsubd_avx2(auVar47,_DAT_00909280);
                auVar47 = *(undefined1 (*) [32])((long)*b_06 + lVar32);
                auVar12 = vpcmpgtd_avx2(auVar10,auVar15);
                auVar6 = vblendvps_avx(auVar53._0_32_,local_58,auVar12);
                auVar53 = ZEXT3264(auVar6);
                local_288 = vblendvps_avx(local_288,local_1f8,auVar12);
                auVar11 = vpaddd_avx2(local_f8,*(undefined1 (*) [32])((long)*ptr_00 + lVar32));
                local_218 = vblendvps_avx(local_218,auVar11,auVar12);
                auVar11._4_4_ = open;
                auVar11._0_4_ = open;
                auVar11._8_4_ = open;
                auVar11._12_4_ = open;
                auVar11._16_4_ = open;
                auVar11._20_4_ = open;
                auVar11._24_4_ = open;
                auVar11._28_4_ = open;
                auVar11 = vpsubd_avx2(auVar45,auVar11);
                auVar12._4_4_ = gap;
                auVar12._0_4_ = gap;
                auVar12._8_4_ = gap;
                auVar12._12_4_ = gap;
                auVar12._16_4_ = gap;
                auVar12._20_4_ = gap;
                auVar12._24_4_ = gap;
                auVar12._28_4_ = gap;
                auVar12 = vpsubd_avx2(*(undefined1 (*) [32])((long)*b + lVar32),auVar12);
                auVar13 = vpcmpgtd_avx2(auVar11,auVar12);
                auVar14 = vpmaxsd_avx2(auVar11,auVar12);
                auVar11 = vblendvps_avx(*(undefined1 (*) [32])((long)*b_00 + lVar32),auVar46,auVar13
                                       );
                auVar12 = vblendvps_avx(*(undefined1 (*) [32])((long)*b_01 + lVar32),auVar39,auVar13
                                       );
                auVar13 = vblendvps_avx(*(undefined1 (*) [32])((long)*b_02 + lVar32),auVar47,auVar13
                                       );
                auVar18 = vpsubd_avx2(auVar13,_DAT_00909280);
                auVar13 = vpcmpgtd_avx2(auVar14,auVar7);
                *(undefined1 (*) [32])((long)*b + lVar32) = auVar14;
                *(undefined1 (*) [32])((long)*b_00 + lVar32) = auVar11;
                local_58 = vblendvps_avx(auVar8,auVar11,auVar13);
                *(undefined1 (*) [32])((long)*b_01 + lVar32) = auVar12;
                local_1f8 = vblendvps_avx(auVar9,auVar12,auVar13);
                local_f8 = vblendvps_avx(auVar17,auVar18,auVar13);
                *(undefined1 (*) [32])((long)*b_02 + lVar32) = auVar18;
                auVar15 = vpmaxsd_avx2(auVar15,auVar10);
                auVar11 = vpmaxsd_avx2(auVar14,auVar7);
                auVar54 = ZEXT3264(auVar11);
                *(undefined1 (*) [32])((long)*b_03 + lVar32) = auVar7;
                *(undefined1 (*) [32])((long)*b_04 + lVar32) = auVar8;
                *(undefined1 (*) [32])((long)*b_05 + lVar32) = auVar9;
                *(undefined1 (*) [32])((long)*b_06 + lVar32) = auVar17;
                lVar32 = lVar32 + 0x20;
              } while (lVar24 != lVar32);
              auVar45 = vperm2f128_avx(local_58,local_58,0x28);
              local_58 = vpalignr_avx2(local_58,auVar45,0xc);
              auVar45 = vperm2i128_avx2(local_1f8,local_1f8,0x28);
              local_1f8 = vpalignr_avx2(local_1f8,auVar45,0xc);
              auVar45 = vperm2i128_avx2(local_f8,local_f8,0x28);
              auVar46 = vperm2i128_avx2(auVar11,auVar11,0x28);
              auVar11 = vpalignr_avx2(auVar11,auVar46,0xc);
              auVar39 = vpaddd_avx2(auVar11,(undefined1  [32])*ptr);
              local_f8 = vpalignr_avx2(local_f8,auVar45,0xc);
              auVar12 = vpcmpgtd_avx2(auVar15,auVar39);
              auVar46 = vblendvps_avx(local_58,auVar6,auVar12);
              auVar45 = vblendvps_avx(local_1f8,local_288,auVar12);
              auVar47 = vpaddd_avx2(local_f8,(undefined1  [32])*ptr_00);
              auVar15 = vpmaxsd_avx2(auVar15,auVar39);
              auVar39 = vblendvps_avx(auVar47,local_218,auVar12);
              iVar23 = 6;
              do {
                auVar47 = vperm2f128_avx(auVar39,auVar39,0x28);
                auVar6 = vperm2f128_avx(auVar45,auVar45,0x28);
                auVar12 = vperm2f128_avx(auVar46,auVar46,0x28);
                auVar13 = vperm2f128_avx(auVar15,auVar15,0x28);
                auVar13 = vpalignr_avx2(auVar15,auVar13,0xc);
                auVar13 = vpaddd_avx2(auVar38,auVar13);
                auVar7 = vpcmpgtd_avx2(auVar15,auVar13);
                auVar15 = vpmaxsd_avx2(auVar15,auVar13);
                auVar12 = vpalignr_avx2(auVar46,auVar12,0xc);
                auVar46 = vblendvps_avx(auVar12,auVar46,auVar7);
                auVar6 = vpalignr_avx2(auVar45,auVar6,0xc);
                auVar45 = vblendvps_avx(auVar6,auVar45,auVar7);
                auVar47 = vpalignr_avx2(auVar39,auVar47,0xc);
                auVar47 = vpaddd_avx2(auVar44,auVar47);
                auVar39 = vblendvps_avx(auVar47,auVar39,auVar7);
                iVar23 = iVar23 + -1;
              } while (iVar23 != 0);
              auVar47 = vperm2i128_avx2(auVar15,auVar15,0x28);
              auVar47 = vpalignr_avx2(auVar15,auVar47,0xc);
              auVar6 = vpaddd_avx2(auVar47,auVar40);
              auVar13 = vpcmpgtd_avx2(auVar6,auVar11);
              auVar47 = vperm2i128_avx2(auVar39,auVar39,0x28);
              auVar12 = vpalignr_avx2(auVar39,auVar47,0xc);
              auVar39 = vblendvps_avx(local_f8,auVar12,auVar13);
              auVar47 = vperm2i128_avx2(auVar45,auVar45,0x28);
              auVar15 = vpalignr_avx2(auVar45,auVar47,0xc);
              auVar45 = vblendvps_avx(local_1f8,auVar15,auVar13);
              auVar47 = vperm2i128_avx2(auVar46,auVar46,0x28);
              auVar47 = vpalignr_avx2(auVar46,auVar47,0xc);
              auVar46 = vblendvps_avx(local_58,auVar47,auVar13);
              auVar11 = vpmaxsd_avx2(auVar6,auVar11);
              lVar25 = 0;
              auVar13._4_4_ = open;
              auVar13._0_4_ = open;
              auVar13._8_4_ = open;
              auVar13._12_4_ = open;
              auVar13._16_4_ = open;
              auVar13._20_4_ = open;
              auVar13._24_4_ = open;
              auVar13._28_4_ = open;
              auVar7._8_4_ = 1;
              auVar7._0_8_ = 0x100000001;
              auVar7._12_4_ = 1;
              auVar7._16_4_ = 1;
              auVar7._20_4_ = 1;
              auVar7._24_4_ = 1;
              auVar7._28_4_ = 1;
              do {
                auVar8 = *(undefined1 (*) [32])((long)*b_03 + lVar25);
                auVar11 = vpsubd_avx2(auVar11,auVar13);
                auVar9._4_4_ = gap;
                auVar9._0_4_ = gap;
                auVar9._8_4_ = gap;
                auVar9._12_4_ = gap;
                auVar9._16_4_ = gap;
                auVar9._20_4_ = gap;
                auVar9._24_4_ = gap;
                auVar9._28_4_ = gap;
                auVar9 = vpsubd_avx2(auVar6,auVar9);
                auVar6 = vpmaxsd_avx2(auVar11,auVar9);
                auVar11 = vpcmpgtd_avx2(auVar11,auVar9);
                auVar47 = vblendvps_avx(auVar47,auVar46,auVar11);
                auVar15 = vblendvps_avx(auVar15,auVar45,auVar11);
                auVar45 = vblendvps_avx(auVar12,auVar39,auVar11);
                auVar12 = vpsubd_avx2(auVar45,_DAT_00909280);
                auVar45 = vpmaxsd_avx2(auVar8,*(undefined1 (*) [32])((long)*b + lVar25));
                auVar10 = vpmaxsd_avx2(auVar45,auVar6);
                auVar11 = vpmaxsd_avx2(auVar10,_DAT_00908c40);
                auVar39 = vpcmpeqd_avx2(auVar11,auVar6);
                auVar45 = vblendvps_avx(*(undefined1 (*) [32])((long)*b_00 + lVar25),auVar47,auVar39
                                       );
                auVar46 = vblendvps_avx(*(undefined1 (*) [32])((long)*b_01 + lVar25),auVar15,auVar39
                                       );
                auVar39 = vblendvps_avx(*(undefined1 (*) [32])((long)*b_02 + lVar25),auVar12,auVar39
                                       );
                auVar9 = vpcmpeqd_avx2(auVar8,auVar11);
                auVar45 = vblendvps_avx(auVar45,*(undefined1 (*) [32])((long)*b_04 + lVar25),auVar9)
                ;
                auVar8 = vblendvps_avx(auVar46,*(undefined1 (*) [32])((long)*b_05 + lVar25),auVar9);
                auVar39 = vblendvps_avx(auVar39,*(undefined1 (*) [32])((long)*b_06 + lVar25),auVar9)
                ;
                auVar9 = vpcmpgtd_avx2(auVar7,auVar10);
                auVar46 = vpandn_avx2(auVar9,auVar45);
                auVar45 = vpandn_avx2(auVar9,auVar8);
                auVar39 = vpandn_avx2(auVar9,auVar39);
                auVar51 = vpmaxsd_avx2(auVar51,auVar11);
                auVar51 = vpmaxsd_avx2(auVar51,auVar46);
                auVar8 = vpmaxsd_avx2(auVar45,auVar39);
                auVar51 = vpmaxsd_avx2(auVar51,auVar8);
                *(undefined1 (*) [32])((long)*b_03 + lVar25) = auVar11;
                *(undefined1 (*) [32])((long)*b_04 + lVar25) = auVar46;
                *(undefined1 (*) [32])((long)*b_05 + lVar25) = auVar45;
                *(undefined1 (*) [32])((long)*b_06 + lVar25) = auVar39;
                auVar19 = vpminsd_avx2(auVar19,auVar11);
                auVar16 = vpmaxsd_avx2(auVar11,auVar16);
                lVar25 = lVar25 + 0x20;
              } while (lVar24 != lVar25);
              auVar45 = vpcmpgtd_avx2(auVar16,local_118);
              if ((((((((auVar45 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                       (auVar45 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                      (auVar45 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                     SUB321(auVar45 >> 0x7f,0) != '\0') ||
                    (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                   SUB321(auVar45 >> 0xbf,0) != '\0') ||
                  (auVar45 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                  auVar45[0x1f] < '\0') {
                auVar45 = vpermq_avx2(auVar16,0x44);
                auVar45 = vpmaxsd_avx2(auVar16,auVar45);
                auVar46 = vpslldq_avx2(auVar45,8);
                auVar45 = vpmaxsd_avx2(auVar45,auVar46);
                auVar46 = vpslldq_avx2(auVar45,4);
                auVar45 = vpmaxsd_avx2(auVar45,auVar46);
                iVar31 = auVar45._28_4_;
                auVar47._8_4_ = 7;
                auVar47._0_8_ = 0x700000007;
                auVar47._12_4_ = 7;
                auVar47._16_4_ = 7;
                auVar47._20_4_ = 7;
                auVar47._24_4_ = 7;
                auVar47._28_4_ = 7;
                local_118 = vpermd_avx2(auVar47,auVar45);
                memcpy(__dest,b_03,__n);
                memcpy(__dest_00,b_04,__n);
                memcpy(__dest_01,b_05,__n);
                b_01 = ptr_01;
                b_00 = ptr_02;
                memcpy(__dest_02,b_06,__n);
                local_2fc = (int)uVar35;
                ptr_01 = b_01;
                ptr_02 = b_00;
              }
              uVar35 = uVar35 + 1;
            } while (uVar35 != (uint)s2Len);
            if ((uVar21 + 7 & 0x7ffffff8) == 0) {
              iVar23 = 0;
              iVar27 = 0;
              iVar30 = 0;
            }
            else {
              uVar35 = 0;
              iVar30 = 0;
              iVar27 = 0;
              iVar23 = 0;
              do {
                if ((*(int *)((long)*__dest + uVar35 * 4) == iVar31) &&
                   (uVar33 = ((uint)uVar35 & 7) * uVar34 + ((uint)(uVar35 >> 3) & 0x1fffffff),
                   (int)uVar33 < (int)uVar21)) {
                  iVar23 = *(int *)((long)*__dest_00 + uVar35 * 4);
                  iVar27 = *(int *)((long)*__dest_01 + uVar35 * 4);
                  iVar30 = *(int *)((long)*__dest_02 + uVar35 * 4);
                  uVar21 = (ulong)uVar33;
                }
                uVar33 = (uint)uVar21;
                uVar35 = uVar35 + 1;
              } while ((uVar34 & 0xfffffff) << 3 != (int)uVar35);
            }
            auVar6._4_4_ = iVar29;
            auVar6._0_4_ = iVar29;
            auVar6._8_4_ = iVar29;
            auVar6._12_4_ = iVar29;
            auVar6._16_4_ = iVar29;
            auVar6._20_4_ = iVar29;
            auVar6._24_4_ = iVar29;
            auVar6._28_4_ = iVar29;
            auVar38 = vpcmpgtd_avx2(auVar6,auVar19);
            auVar8._4_4_ = iVar36;
            auVar8._0_4_ = iVar36;
            auVar8._8_4_ = iVar36;
            auVar8._12_4_ = iVar36;
            auVar8._16_4_ = iVar36;
            auVar8._20_4_ = iVar36;
            auVar8._24_4_ = iVar36;
            auVar8._28_4_ = iVar36;
            auVar44 = vpcmpgtd_avx2(auVar51,auVar8);
            auVar38 = vpor_avx2(auVar44,auVar38);
            if ((((((((auVar38 >> 0x1f & (undefined1  [32])0x1) != (undefined1  [32])0x0 ||
                     (auVar38 >> 0x3f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                    (auVar38 >> 0x5f & (undefined1  [32])0x1) != (undefined1  [32])0x0) ||
                   SUB321(auVar38 >> 0x7f,0) != '\0') ||
                  (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                 SUB321(auVar38 >> 0xbf,0) != '\0') ||
                (auVar38 & (undefined1  [32])0x100000000) != (undefined1  [32])0x0) ||
                auVar38[0x1f] < '\0') {
              *(byte *)&ppVar22->flag = (byte)ppVar22->flag | 0x40;
              iVar31 = 0;
              iVar23 = 0;
              iVar27 = 0;
              iVar30 = 0;
              local_2fc = 0;
              uVar33 = 0;
            }
            ppVar22->score = iVar31;
            ppVar22->end_query = uVar33;
            ppVar22->end_ref = local_2fc;
            ((ppVar22->field_4).stats)->matches = iVar23;
            ((ppVar22->field_4).stats)->similar = iVar27;
            ((ppVar22->field_4).stats)->length = iVar30;
            parasail_free(ptr_00);
            parasail_free(ptr);
            parasail_free(__dest_02);
            parasail_free(__dest_01);
            parasail_free(__dest_00);
            parasail_free(__dest);
            parasail_free(b_06);
            parasail_free(b_05);
            parasail_free(b_04);
            parasail_free(b_03);
            parasail_free(b_02);
            parasail_free(ptr_01);
            parasail_free(ptr_02);
            parasail_free(b);
            return ppVar22;
          }
        }
      }
    }
  }
  return (parasail_result_t *)0x0;
}

Assistant:

parasail_result_t* PNAME(
        const parasail_profile_t * const restrict profile,
        const char * const restrict s2, const int s2Len,
        const int open, const int gap)
{
    /* declare local variables */
    int32_t i = 0;
    int32_t j = 0;
    int32_t end_query = 0;
    int32_t end_ref = 0;
    int32_t s1Len = 0;
    const parasail_matrix_t *matrix = NULL;
    int32_t segWidth = 0;
    int32_t segLen = 0;
#ifdef PARASAIL_ROWCOL
    int32_t offset = 0;
    int32_t position = 0;
#endif
    __m256i* restrict pvP = NULL;
    __m256i* restrict pvPm = NULL;
    __m256i* restrict pvPs = NULL;
    __m256i* restrict pvE = NULL;
    __m256i* restrict pvEM = NULL;
    __m256i* restrict pvES = NULL;
    __m256i* restrict pvEL = NULL;
    __m256i* restrict pvH = NULL;
    __m256i* restrict pvHM = NULL;
    __m256i* restrict pvHS = NULL;
    __m256i* restrict pvHL = NULL;
    __m256i* restrict pvHMax = NULL;
    __m256i* restrict pvHMMax = NULL;
    __m256i* restrict pvHSMax = NULL;
    __m256i* restrict pvHLMax = NULL;
    __m256i* restrict pvGapper = NULL;
    __m256i* restrict pvGapperL = NULL;
    __m256i vGapO;
    __m256i vGapE;
    int32_t NEG_LIMIT = 0;
    int32_t POS_LIMIT = 0;
    __m256i vZero;
    __m256i vOne;
    int32_t score = 0;
    int32_t matches = 0;
    int32_t similar = 0;
    int32_t length = 0;
    __m256i vNegLimit;
    __m256i vPosLimit;
    __m256i vSaturationCheckMin;
    __m256i vSaturationCheckMax;
    __m256i vMaxH;
    __m256i vMaxM;
    __m256i vMaxS;
    __m256i vMaxL;
    __m256i vMaxHUnit;
    __m256i vNegInfFront;
    __m256i vSegLenXgap;
    __m256i vSegLen;
    parasail_result_t *result = NULL;

    /* validate inputs */
    PARASAIL_CHECK_NULL(profile);
    PARASAIL_CHECK_NULL(profile->profile32.score);
    PARASAIL_CHECK_NULL(profile->matrix);
    PARASAIL_CHECK_GT0(profile->s1Len);
    PARASAIL_CHECK_NULL(s2);
    PARASAIL_CHECK_GT0(s2Len);
    PARASAIL_CHECK_GE0(open);
    PARASAIL_CHECK_GE0(gap);

    /* initialize stack variables */
    i = 0;
    j = 0;
    end_query = 0;
    end_ref = 0;
    s1Len = profile->s1Len;
    matrix = profile->matrix;
    segWidth = 8; /* number of values in vector unit */
    segLen = (s1Len + segWidth - 1) / segWidth;
#ifdef PARASAIL_ROWCOL
    offset = (s1Len - 1) % segLen;
    position = (segWidth - 1) - (s1Len - 1) / segLen;
#endif
    pvP  = (__m256i*)profile->profile32.score;
    pvPm = (__m256i*)profile->profile32.matches;
    pvPs = (__m256i*)profile->profile32.similar;
    vGapO = _mm256_set1_epi32(open);
    vGapE = _mm256_set1_epi32(gap);
    NEG_LIMIT = (-open < matrix->min ? INT32_MIN + open : INT32_MIN - matrix->min) + 1;
    POS_LIMIT = INT32_MAX - matrix->max - 1;
    vZero = _mm256_setzero_si256();
    vOne = _mm256_set1_epi32(1);
    score = NEG_LIMIT;
    matches = 0;
    similar = 0;
    length = 0;
    vNegLimit = _mm256_set1_epi32(NEG_LIMIT);
    vPosLimit = _mm256_set1_epi32(POS_LIMIT);
    vSaturationCheckMin = vPosLimit;
    vSaturationCheckMax = vNegLimit;
    vMaxH = vNegLimit;
    vMaxM = vNegLimit;
    vMaxS = vNegLimit;
    vMaxL = vNegLimit;
    vMaxHUnit = vNegLimit;
    vSegLen = _mm256_slli_si256_rpl(_mm256_set1_epi32(segLen), 4);
    vNegInfFront = vZero;
    vNegInfFront = _mm256_insert_epi32_rpl(vNegInfFront, NEG_LIMIT, 0);
    vSegLenXgap = _mm256_add_epi32(vNegInfFront,
            _mm256_slli_si256_rpl(_mm256_set1_epi32(-segLen*gap), 4));

    /* initialize result */
#ifdef PARASAIL_TABLE
    result = parasail_result_new_table3(segLen*segWidth, s2Len);
#else
#ifdef PARASAIL_ROWCOL
    result = parasail_result_new_rowcol3(segLen*segWidth, s2Len);
#else
    result = parasail_result_new_stats();
#endif
#endif
    if (!result) return NULL;

    /* set known flags */
    result->flag |= PARASAIL_FLAG_SW | PARASAIL_FLAG_SCAN
        | PARASAIL_FLAG_STATS
        | PARASAIL_FLAG_BITS_32 | PARASAIL_FLAG_LANES_8;
#ifdef PARASAIL_TABLE
    result->flag |= PARASAIL_FLAG_TABLE;
#endif
#ifdef PARASAIL_ROWCOL
    result->flag |= PARASAIL_FLAG_ROWCOL;
#endif

    /* initialize heap variables */
    pvE  = parasail_memalign___m256i(32, segLen);
    pvEM = parasail_memalign___m256i(32, segLen);
    pvES = parasail_memalign___m256i(32, segLen);
    pvEL = parasail_memalign___m256i(32, segLen);
    pvH  = parasail_memalign___m256i(32, segLen);
    pvHM = parasail_memalign___m256i(32, segLen);
    pvHS = parasail_memalign___m256i(32, segLen);
    pvHL = parasail_memalign___m256i(32, segLen);
    pvHMax  = parasail_memalign___m256i(32, segLen);
    pvHMMax = parasail_memalign___m256i(32, segLen);
    pvHSMax = parasail_memalign___m256i(32, segLen);
    pvHLMax = parasail_memalign___m256i(32, segLen);
    pvGapper = parasail_memalign___m256i(32, segLen);
    pvGapperL = parasail_memalign___m256i(32, segLen);

    /* validate heap variables */
    if (!pvE) return NULL;
    if (!pvEM) return NULL;
    if (!pvES) return NULL;
    if (!pvEL) return NULL;
    if (!pvH) return NULL;
    if (!pvHM) return NULL;
    if (!pvHS) return NULL;
    if (!pvHL) return NULL;
    if (!pvHMax) return NULL;
    if (!pvHMMax) return NULL;
    if (!pvHSMax) return NULL;
    if (!pvHLMax) return NULL;
    if (!pvGapper) return NULL;
    if (!pvGapperL) return NULL;

    parasail_memset___m256i(pvH, vZero, segLen);
    parasail_memset___m256i(pvHM, vZero, segLen);
    parasail_memset___m256i(pvHS, vZero, segLen);
    parasail_memset___m256i(pvHL, vZero, segLen);
    parasail_memset___m256i(pvE, vNegLimit, segLen);
    parasail_memset___m256i(pvEM, vZero, segLen);
    parasail_memset___m256i(pvES, vZero, segLen);
    parasail_memset___m256i(pvEL, vZero, segLen);
    {
        __m256i vGapper = _mm256_sub_epi32(vZero,vGapO);
        __m256i vGapperL = vOne;
        for (i=segLen-1; i>=0; --i) {
            _mm256_store_si256(pvGapper+i, vGapper);
            _mm256_store_si256(pvGapperL+i, vGapperL);
            vGapper = _mm256_sub_epi32(vGapper, vGapE);
            vGapperL = _mm256_add_epi32(vGapperL, vOne);
        }
    }

    /* outer loop over database sequence */
    for (j=0; j<s2Len; ++j) {
        __m256i vE;
        __m256i vE_ext;
        __m256i vE_opn;
        __m256i vEM;
        __m256i vES;
        __m256i vEL;
        __m256i vHt;
        __m256i vHtM;
        __m256i vHtS;
        __m256i vHtL;
        __m256i vF;
        __m256i vF_ext;
        __m256i vF_opn;
        __m256i vFM;
        __m256i vFS;
        __m256i vFL;
        __m256i vH;
        __m256i vHM;
        __m256i vHS;
        __m256i vHL;
        __m256i vHp;
        __m256i vHpM;
        __m256i vHpS;
        __m256i vHpL;
        __m256i *pvW;
        __m256i vW;
        __m256i *pvWM;
        __m256i vWM;
        __m256i *pvWS;
        __m256i vWS;
        __m256i case1;
        __m256i case2;
        __m256i case0;
        __m256i vGapper;
        __m256i vGapperL;

        /* calculate E */
        /* calculate Ht */
        /* calculate F and H first pass */
        vHp = _mm256_load_si256(pvH+(segLen-1));
        vHpM = _mm256_load_si256(pvHM+(segLen-1));
        vHpS = _mm256_load_si256(pvHS+(segLen-1));
        vHpL = _mm256_load_si256(pvHL+(segLen-1));
        vHp = _mm256_slli_si256_rpl(vHp, 4);
        vHpM = _mm256_slli_si256_rpl(vHpM, 4);
        vHpS = _mm256_slli_si256_rpl(vHpS, 4);
        vHpL = _mm256_slli_si256_rpl(vHpL, 4);
        pvW = pvP + matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWM= pvPm+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        pvWS= pvPs+ matrix->mapper[(unsigned char)s2[j]]*segLen;
        vHt = vZero;
        vF = vNegLimit;
        vFM = vZero;
        vFS = vZero;
        vFL = vZero;
        for (i=0; i<segLen; ++i) {
            vH = _mm256_load_si256(pvH+i);
            vHM= _mm256_load_si256(pvHM+i);
            vHS= _mm256_load_si256(pvHS+i);
            vHL= _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM= _mm256_load_si256(pvEM+i);
            vES= _mm256_load_si256(pvES+i);
            vEL= _mm256_load_si256(pvEL+i);
            vW = _mm256_load_si256(pvW+i);
            vWM = _mm256_load_si256(pvWM+i);
            vWS = _mm256_load_si256(pvWS+i);
            vGapper = _mm256_load_si256(pvGapper+i);
            vGapperL = _mm256_load_si256(pvGapperL+i);
            vE_opn = _mm256_sub_epi32(vH, vGapO);
            vE_ext = _mm256_sub_epi32(vE, vGapE);
            case1 = _mm256_cmpgt_epi32(vE_opn, vE_ext);
            vE = _mm256_max_epi32(vE_opn, vE_ext);
            vEM = _mm256_blendv_epi8(vEM, vHM, case1);
            vES = _mm256_blendv_epi8(vES, vHS, case1);
            vEL = _mm256_blendv_epi8(vEL, vHL, case1);
            vEL = _mm256_add_epi32(vEL, vOne);
            vGapper = _mm256_add_epi32(vHt, vGapper);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi32(vF, vGapper),
                    _mm256_cmpeq_epi32(vF, vGapper));
            vF = _mm256_max_epi32(vF, vGapper);
            vFM = _mm256_blendv_epi8(vHtM, vFM, case1);
            vFS = _mm256_blendv_epi8(vHtS, vFS, case1);
            vFL = _mm256_blendv_epi8(
                    _mm256_add_epi32(vHtL, vGapperL),
                    vFL, case1);
            vHp = _mm256_add_epi32(vHp, vW);
            vHpM = _mm256_add_epi32(vHpM, vWM);
            vHpS = _mm256_add_epi32(vHpS, vWS);
            vHpL = _mm256_add_epi32(vHpL, vOne);
            case1 = _mm256_cmpgt_epi32(vE, vHp);
            vHt = _mm256_max_epi32(vE, vHp);
            vHtM = _mm256_blendv_epi8(vHpM, vEM, case1);
            vHtS = _mm256_blendv_epi8(vHpS, vES, case1);
            vHtL = _mm256_blendv_epi8(vHpL, vEL, case1);
            _mm256_store_si256(pvE+i, vE);
            _mm256_store_si256(pvEM+i, vEM);
            _mm256_store_si256(pvES+i, vES);
            _mm256_store_si256(pvEL+i, vEL);
            _mm256_store_si256(pvH+i, vHp);
            _mm256_store_si256(pvHM+i, vHpM);
            _mm256_store_si256(pvHS+i, vHpS);
            _mm256_store_si256(pvHL+i, vHpL);
            vHp = vH;
            vHpM = vHM;
            vHpS = vHS;
            vHpL = vHL;
        }

        /* pseudo prefix scan on F and H */
        vHt = _mm256_slli_si256_rpl(vHt, 4);
        vHtM = _mm256_slli_si256_rpl(vHtM, 4);
        vHtS = _mm256_slli_si256_rpl(vHtS, 4);
        vHtL = _mm256_slli_si256_rpl(vHtL, 4);
        vGapper = _mm256_load_si256(pvGapper);
        vGapperL = _mm256_load_si256(pvGapperL);
        vGapper = _mm256_add_epi32(vHt, vGapper);
        case1 = _mm256_or_si256(
                _mm256_cmpgt_epi32(vGapper, vF),
                _mm256_cmpeq_epi32(vGapper, vF));
        vF = _mm256_max_epi32(vF, vGapper);
        vFM = _mm256_blendv_epi8(vFM, vHtM, case1);
        vFS = _mm256_blendv_epi8(vFS, vHtS, case1);
        vFL = _mm256_blendv_epi8(
                vFL,
                _mm256_add_epi32(vHtL, vGapperL),
                case1);
        for (i=0; i<segWidth-2; ++i) {
            __m256i vFt = _mm256_slli_si256_rpl(vF, 4);
            __m256i vFtM = _mm256_slli_si256_rpl(vFM, 4);
            __m256i vFtS = _mm256_slli_si256_rpl(vFS, 4);
            __m256i vFtL = _mm256_slli_si256_rpl(vFL, 4);
            vFt = _mm256_add_epi32(vFt, vSegLenXgap);
            case1 = _mm256_or_si256(
                    _mm256_cmpgt_epi32(vFt, vF),
                    _mm256_cmpeq_epi32(vFt, vF));
            vF = _mm256_max_epi32(vF, vFt);
            vFM = _mm256_blendv_epi8(vFM, vFtM, case1);
            vFS = _mm256_blendv_epi8(vFS, vFtS, case1);
            vFL = _mm256_blendv_epi8(
                    vFL,
                    _mm256_add_epi32(vFtL, vSegLen),
                    case1);
        }

        /* calculate final H */
        vF = _mm256_slli_si256_rpl(vF, 4);
        vFM = _mm256_slli_si256_rpl(vFM, 4);
        vFS = _mm256_slli_si256_rpl(vFS, 4);
        vFL = _mm256_slli_si256_rpl(vFL, 4);
        vF = _mm256_add_epi32(vF, vNegInfFront);
        case1 = _mm256_cmpgt_epi32(vF, vHt);
        vH = _mm256_max_epi32(vF, vHt);
        vHM = _mm256_blendv_epi8(vHtM, vFM, case1);
        vHS = _mm256_blendv_epi8(vHtS, vFS, case1);
        vHL = _mm256_blendv_epi8(vHtL, vFL, case1);
        for (i=0; i<segLen; ++i) {
            vHp = _mm256_load_si256(pvH+i);
            vHpM = _mm256_load_si256(pvHM+i);
            vHpS = _mm256_load_si256(pvHS+i);
            vHpL = _mm256_load_si256(pvHL+i);
            vE = _mm256_load_si256(pvE+i);
            vEM = _mm256_load_si256(pvEM+i);
            vES = _mm256_load_si256(pvES+i);
            vEL = _mm256_load_si256(pvEL+i);
            vF_opn = _mm256_sub_epi32(vH, vGapO);
            vF_ext = _mm256_sub_epi32(vF, vGapE);
            vF = _mm256_max_epi32(vF_opn, vF_ext);
            case1 = _mm256_cmpgt_epi32(vF_opn, vF_ext);
            vFM = _mm256_blendv_epi8(vFM, vHM, case1);
            vFS = _mm256_blendv_epi8(vFS, vHS, case1);
            vFL = _mm256_blendv_epi8(vFL, vHL, case1);
            vFL = _mm256_add_epi32(vFL, vOne);
            vH = _mm256_max_epi32(vHp, vE);
            vH = _mm256_max_epi32(vH, vF);
            vH = _mm256_max_epi32(vH, vZero);
            case1 = _mm256_cmpeq_epi32(vH, vHp);
            case2 = _mm256_cmpeq_epi32(vH, vF);
            case0 = _mm256_cmpeq_epi32(vH, vZero);
            vHM = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEM, vFM, case2),
                    vHpM, case1);
            vHM = _mm256_blendv_epi8(vHM, vZero, case0);
            vHS = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vES, vFS, case2),
                    vHpS, case1);
            vHS = _mm256_blendv_epi8(vHS, vZero, case0);
            vHL = _mm256_blendv_epi8(
                    _mm256_blendv_epi8(vEL, vFL, case2),
                    vHpL, case1);
            vHL = _mm256_blendv_epi8(vHL, vZero, case0);
            _mm256_store_si256(pvH+i, vH);
            _mm256_store_si256(pvHM+i, vHM);
            _mm256_store_si256(pvHS+i, vHS);
            _mm256_store_si256(pvHL+i, vHL);
            vSaturationCheckMin = _mm256_min_epi32(vSaturationCheckMin, vH);
            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vH);
            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vHM);
            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vHS);
            vSaturationCheckMax = _mm256_max_epi32(vSaturationCheckMax, vHL);
#ifdef PARASAIL_TABLE
            arr_store_si256(result->stats->tables->score_table, vH, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->matches_table, vHM, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->similar_table, vHS, i, segLen, j, s2Len);
            arr_store_si256(result->stats->tables->length_table, vHL, i, segLen, j, s2Len);
#endif
            {
                __m256i cond_max = _mm256_cmpgt_epi32(vH, vMaxH);
                vMaxH = _mm256_max_epi32(vH, vMaxH);
                vMaxM = _mm256_blendv_epi8(vMaxM, vHM, cond_max);
                vMaxS = _mm256_blendv_epi8(vMaxS, vHS, cond_max);
                vMaxL = _mm256_blendv_epi8(vMaxL, vHL, cond_max);
            }
        } 

        {
            __m256i vCompare = _mm256_cmpgt_epi32(vMaxH, vMaxHUnit);
            if (_mm256_movemask_epi8(vCompare)) {
                score = _mm256_hmax_epi32_rpl(vMaxH);
                vMaxHUnit = _mm256_set1_epi32(score);
                end_ref = j;
                (void)memcpy(pvHMax, pvH, sizeof(__m256i)*segLen);
                (void)memcpy(pvHMMax, pvHM, sizeof(__m256i)*segLen);
                (void)memcpy(pvHSMax, pvHS, sizeof(__m256i)*segLen);
                (void)memcpy(pvHLMax, pvHL, sizeof(__m256i)*segLen);
            }
        }

#ifdef PARASAIL_ROWCOL
        /* extract last value from the column */
        {
            int32_t k = 0;
            __m256i vH = _mm256_load_si256(pvH + offset);
            __m256i vHM = _mm256_load_si256(pvHM + offset);
            __m256i vHS = _mm256_load_si256(pvHS + offset);
            __m256i vHL = _mm256_load_si256(pvHL + offset);
            for (k=0; k<position; ++k) {
                vH = _mm256_slli_si256_rpl(vH, 4);
                vHM = _mm256_slli_si256_rpl(vHM, 4);
                vHS = _mm256_slli_si256_rpl(vHS, 4);
                vHL = _mm256_slli_si256_rpl(vHL, 4);
            }
            result->stats->rowcols->score_row[j] = (int32_t) _mm256_extract_epi32_rpl (vH, 7);
            result->stats->rowcols->matches_row[j] = (int32_t) _mm256_extract_epi32_rpl (vHM, 7);
            result->stats->rowcols->similar_row[j] = (int32_t) _mm256_extract_epi32_rpl (vHS, 7);
            result->stats->rowcols->length_row[j] = (int32_t) _mm256_extract_epi32_rpl (vHL, 7);
        }
#endif
    }

    /* Trace the alignment ending position on read. */
    {
        int32_t *t = (int32_t*)pvHMax;
        int32_t *m = (int32_t*)pvHMMax;
        int32_t *s = (int32_t*)pvHSMax;
        int32_t *l = (int32_t*)pvHLMax;
        int32_t column_len = segLen * segWidth;
        end_query = s1Len;
        for (i = 0; i<column_len; ++i, ++t, ++m, ++s, ++l) {
            if (*t == score) {
                int32_t temp = i / segWidth + i % segWidth * segLen;
                if (temp < end_query) {
                    end_query = temp;
                    matches = *m;
                    similar = *s;
                    length = *l;
                }
            }
        }
    }

#ifdef PARASAIL_ROWCOL
    for (i=0; i<segLen; ++i) {
        __m256i vH = _mm256_load_si256(pvH+i);
        __m256i vHM = _mm256_load_si256(pvHM+i);
        __m256i vHS = _mm256_load_si256(pvHS+i);
        __m256i vHL = _mm256_load_si256(pvHL+i);
        arr_store_col(result->stats->rowcols->score_col, vH, i, segLen);
        arr_store_col(result->stats->rowcols->matches_col, vHM, i, segLen);
        arr_store_col(result->stats->rowcols->similar_col, vHS, i, segLen);
        arr_store_col(result->stats->rowcols->length_col, vHL, i, segLen);
    }
#endif

    if (_mm256_movemask_epi8(_mm256_or_si256(
            _mm256_cmplt_epi32_rpl(vSaturationCheckMin, vNegLimit),
            _mm256_cmpgt_epi32(vSaturationCheckMax, vPosLimit)))) {
        result->flag |= PARASAIL_FLAG_SATURATED;
        score = 0;
        matches = 0;
        similar = 0;
        length = 0;
        end_query = 0;
        end_ref = 0;
    }

    result->score = score;
    result->end_query = end_query;
    result->end_ref = end_ref;
    result->stats->matches = matches;
    result->stats->similar = similar;
    result->stats->length = length;

    parasail_free(pvGapperL);
    parasail_free(pvGapper);
    parasail_free(pvHLMax);
    parasail_free(pvHSMax);
    parasail_free(pvHMMax);
    parasail_free(pvHMax);
    parasail_free(pvHL);
    parasail_free(pvHS);
    parasail_free(pvHM);
    parasail_free(pvH);
    parasail_free(pvEL);
    parasail_free(pvES);
    parasail_free(pvEM);
    parasail_free(pvE);

    return result;
}